

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<Assimp::FIDoubleValue> __thiscall
Assimp::FIDoubleValue::create(FIDoubleValue *this,vector<double,_std::allocator<double>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIDoubleValue> sVar1;
  undefined1 local_29;
  FIValue local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28._vptr_FIValue = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIDoubleValueImpl,std::allocator<Assimp::FIDoubleValueImpl>,std::vector<double,std::allocator<double>>>
            (&local_20,(FIDoubleValueImpl **)&local_28,
             (allocator<Assimp::FIDoubleValueImpl> *)&local_29,value);
  (this->super_FIValue)._vptr_FIValue = local_28._vptr_FIValue;
  (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_20._M_pi;
  sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIDoubleValue>)
         sVar1.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIDoubleValue> FIDoubleValue::create(std::vector<double> &&value) {
    return std::make_shared<FIDoubleValueImpl>(std::move(value));
}